

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

void j2k_read_crg(opj_j2k_t *j2k)

{
  OPJ_UINT32 OVar1;
  opj_cio_t *cio;
  OPJ_UINT32 OVar2;
  bool bVar3;
  
  cio = j2k->cio;
  OVar1 = j2k->image->numcomps;
  cio_read(cio,2);
  OVar2 = 0;
  if (0 < (int)OVar1) {
    OVar2 = OVar1;
  }
  while (bVar3 = OVar2 != 0, OVar2 = OVar2 - 1, bVar3) {
    cio_read(cio,2);
    cio_read(cio,2);
  }
  return;
}

Assistant:

static void j2k_read_crg(opj_j2k_t *j2k) {
	int len, i, Xcrg_i, Ycrg_i;
	
	opj_cio_t *cio = j2k->cio;
	int numcomps = j2k->image->numcomps;
	
	len = cio_read(cio, 2);			/* Lcrg */
	for (i = 0; i < numcomps; i++) {
		Xcrg_i = cio_read(cio, 2);	/* Xcrg_i */
		Ycrg_i = cio_read(cio, 2);	/* Ycrg_i */
	}
}